

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void pack_map_tokens(aom_writer *w,TokenExtra **tp,int n,int num,MapCdf map_pb_cdf)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  aom_writer *in_R8;
  aom_cdf_prob *color_map_cdf;
  int i;
  int palette_size_idx;
  TokenExtra *p;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = (char *)*in_RSI;
  iVar1 = in_EDX + -2;
  write_uniform((aom_writer *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8);
  for (iVar2 = 0; pcVar3 = pcVar3 + 1, iVar2 < in_ECX + -1; iVar2 = iVar2 + 1) {
    aom_write_symbol(in_R8,(int)((ulong)pcVar3 >> 0x20),(aom_cdf_prob *)CONCAT44(iVar1,iVar2),
                     (int)((ulong)((long)in_R8 + (long)(*pcVar3 >> 4) * 0x12 + (long)iVar1 * 0x5a)
                          >> 0x20));
  }
  *in_RSI = pcVar3;
  return;
}

Assistant:

static inline void pack_map_tokens(aom_writer *w, const TokenExtra **tp, int n,
                                   int num, MapCdf map_pb_cdf) {
  const TokenExtra *p = *tp;
  const int palette_size_idx = n - PALETTE_MIN_SIZE;
  write_uniform(w, n, p->token);  // The first color index.
  ++p;
  --num;
  for (int i = 0; i < num; ++i) {
    assert((p->color_ctx >= 0) &&
           (p->color_ctx < PALETTE_COLOR_INDEX_CONTEXTS));
    aom_cdf_prob *color_map_cdf = map_pb_cdf[palette_size_idx][p->color_ctx];
    aom_write_symbol(w, p->token, color_map_cdf, n);
    ++p;
  }
  *tp = p;
}